

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O2

void __thiscall Kernel::Signature::RealSymbol::RealSymbol(RealSymbol *this,RealConstantType *val)

{
  TermList resultSort;
  OperatorType *type;
  char (*in_R8) [2];
  string sStack_38;
  
  if (*(int *)(Lib::env + 0x83d0) == 2) {
    Lib::Output::toString<char[10],Kernel::RealConstantType,char[2]>
              (&sStack_38,(Output *)"$to_real(",(char (*) [10])val,(RealConstantType *)0x7410c8,
               in_R8);
  }
  else {
    Lib::Output::toString<Kernel::RealConstantType>(&sStack_38,val);
  }
  Symbol::Symbol(&this->super_Symbol,&sStack_38,0,true,false,false);
  std::__cxx11::string::~string((string *)&sStack_38);
  RationalConstantType::RationalConstantType
            (&(this->_realValue).super_RationalConstantType,&val->super_RationalConstantType);
  resultSort = AtomicSort::realSort();
  type = OperatorType::getConstantsType(resultSort,0);
  Symbol::setType(&this->super_Symbol,type);
  return;
}

Assistant:

RealSymbol(const RealConstantType& val)
    : Symbol((env.options->proof() == Shell::Options::Proof::PROOFCHECK) ? Output::toString("$to_real(",val,")") 
                                                                         : Output::toString(val),
        /*             arity */ 0, 
        /*       interpreted */ true, 
        /*    preventQuoting */ false, 
        /*             super */ false),
       _realValue(std::move(val))
    {
      setType(OperatorType::getConstantsType(AtomicSort::realSort()));
    }